

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  FunctionPrototypeSyntax *node;
  ExternInterfaceMethodSyntax *pEVar1;
  FunctionPrototypeSyntax *unaff_retaddr;
  Token *in_stack_00000008;
  Token *in_stack_00000010;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  BumpAllocator *in_stack_00000058;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000060;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  
  node = (FunctionPrototypeSyntax *)
         deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000060,in_stack_00000058);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::FunctionPrototypeSyntax_*>::operator*
            ((not_null<slang::syntax::FunctionPrototypeSyntax_*> *)0xa570d7);
  deepClone<slang::syntax::FunctionPrototypeSyntax>(node,(BumpAllocator *)__child_stack);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::ExternInterfaceMethodSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::FunctionPrototypeSyntax&,slang::parsing::Token>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      unaff_retaddr,(Token *)__fn);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const ExternInterfaceMethodSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ExternInterfaceMethodSyntax>(
        *deepClone(node.attributes, alloc),
        node.externKeyword.deepClone(alloc),
        node.forkJoin.deepClone(alloc),
        *deepClone<FunctionPrototypeSyntax>(*node.prototype, alloc),
        node.semi.deepClone(alloc)
    );
}